

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O3

void peparse::deleteBuffer(bounded_buffer *b)

{
  if (b != (bounded_buffer *)0x0) {
    if (b->copy == false) {
      munmap(b->buf,(ulong)b->bufLen);
      close(b->detail->fd);
    }
    operator_delete(b->detail,4);
    operator_delete(b,0x18);
    return;
  }
  return;
}

Assistant:

void deleteBuffer(bounded_buffer *b) {
  if (b == nullptr) {
    return;
  }

  if (!b->copy) {
#ifdef _WIN32
    UnmapViewOfFile(b->buf);
    CloseHandle(b->detail->sec);
    CloseHandle(b->detail->file);
#else
    munmap(b->buf, b->bufLen);
    close(b->detail->fd);
#endif
  }

  delete b->detail;
  delete b;
}